

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  float *pfVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  ImGuiShrinkWidthItem *pIVar5;
  ImVec2 IVar6;
  ImGuiID IVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  ImGuiID IVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  ImGuiContext *pIVar16;
  undefined4 uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int section_n;
  int iVar21;
  long lVar22;
  ImGuiID *pIVar23;
  char *__dest;
  uint uVar24;
  char *pcVar25;
  ulong uVar26;
  int iVar27;
  ImGuiTabItem *pIVar28;
  ImGuiTabItem *pIVar29;
  uint uVar30;
  ulong uVar31;
  ImGuiTabItem *pIVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  long lVar37;
  ImGuiContext *pIVar38;
  ImGuiTabItem *unaff_R14;
  size_t size;
  int iVar39;
  ImGuiID *pIVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  ImGuiID local_104;
  undefined8 local_100;
  float local_f8 [3];
  uint uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  undefined1 local_c8 [16];
  int local_b4 [2];
  float local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ImVec4 local_88;
  ImVec2 local_70;
  ImGuiID *local_68;
  undefined8 local_60;
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  local_100 = GImGui;
  tab_bar->WantLayout = false;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  stack0xffffffffffffff10 = 0;
  local_d8 = 0.0;
  uVar36 = (tab_bar->Tabs).Size;
  uVar33 = (ulong)uVar36;
  if ((int)uVar36 < 1) {
    bVar18 = false;
    uVar24 = 0;
  }
  else {
    lVar22 = 0;
    uVar31 = 0;
    uVar24 = 0;
    bVar18 = false;
    do {
      pIVar28 = (tab_bar->Tabs).Data;
      pIVar40 = (ImGuiID *)((long)&pIVar28->ID + lVar22);
      if ((*(int *)((long)&pIVar28->LastFrameVisible + lVar22) < tab_bar->PrevFrameVisible) ||
         ((&pIVar28->WantClose)[lVar22] == true)) {
        IVar3 = *pIVar40;
        if (tab_bar->VisibleTabId == IVar3) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar3) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar3) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        uVar26 = (ulong)uVar24;
        if (uVar31 != uVar26) {
          if (((int)uVar24 < 0) || ((int)uVar33 <= (int)uVar24)) goto LAB_00154488;
          *(undefined8 *)((long)&pIVar28[uVar26].NameOffset + 1) =
               *(undefined8 *)((long)pIVar40 + 0x1d);
          IVar3 = *pIVar40;
          IVar7 = pIVar40[1];
          IVar8 = pIVar40[2];
          IVar9 = pIVar40[3];
          fVar43 = (float)pIVar40[5];
          fVar41 = (float)pIVar40[6];
          IVar10 = pIVar40[7];
          pfVar2 = &pIVar28[uVar26].Offset;
          *pfVar2 = (float)pIVar40[4];
          pfVar2[1] = fVar43;
          pfVar2[2] = fVar41;
          pfVar2[3] = (float)IVar10;
          pIVar28 = pIVar28 + uVar26;
          pIVar28->ID = IVar3;
          pIVar28->Flags = IVar7;
          pIVar28->LastFrameVisible = IVar8;
          pIVar28->LastFrameSelected = IVar9;
        }
        if (((int)uVar24 < 0) || ((tab_bar->Tabs).Size <= (int)uVar24)) goto LAB_00154488;
        pIVar28 = (tab_bar->Tabs).Data;
        pIVar28[uVar26].IndexDuringLayout = (ImS16)uVar24;
        uVar36 = pIVar28[uVar26].Flags;
        unaff_R14 = (ImGuiTabItem *)((ulong)((char)uVar36 < '\0') + 1);
        pIVar29 = (ImGuiTabItem *)0x0;
        if ((uVar36 & 0x40) == 0) {
          pIVar29 = unaff_R14;
        }
        if (0 < (int)uVar24) {
          if ((tab_bar->Tabs).Size < (int)uVar24) goto LAB_00154488;
          unaff_R14 = (ImGuiTabItem *)(ulong)(uVar36 & 0xc0);
          bVar19 = bVar18;
          if ((pIVar28[uVar26 - 1].Flags & 0x40U) == 0) {
            bVar19 = true;
          }
          if ((uVar36 & 0x40) == 0) {
            bVar19 = bVar18;
          }
          bVar18 = bVar19;
          if ((pIVar28[uVar26 - 1].Flags & 0xc0U) == 0x80) {
            bVar18 = true;
          }
          if ((uVar36 & 0xc0) == 0x80) {
            bVar18 = bVar19;
          }
        }
        local_f8[(long)pIVar29 * 3] = (float)((int)local_f8[(long)pIVar29 * 3] + 1);
        uVar24 = uVar24 + 1;
      }
      uVar31 = uVar31 + 1;
      uVar36 = (tab_bar->Tabs).Size;
      uVar33 = (ulong)(int)uVar36;
      lVar22 = lVar22 + 0x28;
    } while ((long)uVar31 < (long)uVar33);
  }
  if (uVar36 != uVar24) {
    iVar21 = (tab_bar->Tabs).Capacity;
    if (iVar21 < (int)uVar24) {
      if (iVar21 == 0) {
        uVar36 = 8;
      }
      else {
        uVar36 = iVar21 / 2 + iVar21;
      }
      if ((int)uVar36 <= (int)uVar24) {
        uVar36 = uVar24;
      }
      if (iVar21 < (int)uVar36) {
        unaff_R14 = (ImGuiTabItem *)MemAlloc((long)(int)uVar36 * 0x28);
        pIVar28 = (tab_bar->Tabs).Data;
        if (pIVar28 != (ImGuiTabItem *)0x0) {
          memcpy(unaff_R14,pIVar28,(long)(tab_bar->Tabs).Size * 0x28);
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = unaff_R14;
        (tab_bar->Tabs).Capacity = uVar36;
      }
    }
    (tab_bar->Tabs).Size = uVar24;
  }
  pIVar38 = local_100;
  if (bVar18) {
    qsort((tab_bar->Tabs).Data,(long)(tab_bar->Tabs).Size,0x28,TabItemComparerBySection);
  }
  fVar42 = local_f8[0];
  fVar41 = 0.0;
  fVar43 = 0.0;
  iVar21 = (int)uStack_e0;
  if ((0 < (int)local_f8[0]) &&
     ((int)uStack_e0 + uStack_ec != 0 &&
      SCARRY4((int)uStack_e0,uStack_ec) == (int)((int)uStack_e0 + uStack_ec) < 0)) {
    fVar43 = (pIVar38->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff10 = CONCAT44(uStack_ec,fVar43);
  if (0 < (int)uStack_e0 && 0 < (int)uStack_ec) {
    fVar41 = (pIVar38->Style).ItemInnerSpacing.x;
  }
  local_e8 = CONCAT44(fVar41,(float)local_e8);
  local_104 = tab_bar->NextSelectedTabId;
  if (local_104 == 0) {
    local_104 = 0;
  }
  else {
    tab_bar->SelectedTabId = local_104;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar18 = TabBarProcessReorder(tab_bar);
    if ((bVar18) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      local_104 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar16 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar4 = GImGui->CurrentWindow;
    fVar43 = (GImGui->Style).FramePadding.y;
    fVar41 = GImGui->FontSize;
    local_a8._0_4_ = (pIVar4->DC).CursorPos.x;
    local_a8._4_4_ = (pIVar4->DC).CursorPos.y;
    fVar44 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar43;
    local_c8._0_8_ = pIVar4;
    (pIVar4->DC).CursorPos.y = fVar44;
    (tab_bar->BarRect).Min.x = fVar41 + fVar43 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar16->Style).Colors[0].x;
    local_58.y = (pIVar16->Style).Colors[0].y;
    uVar11 = (pIVar16->Style).Colors[0].z;
    uVar12 = (pIVar16->Style).Colors[0].w;
    local_58.w = (float)uVar12 * 0.5;
    local_58.z = (float)uVar11;
    unaff_R14 = (ImGuiTabItem *)0x0;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar18 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar18) {
      if ((tab_bar->Tabs).Size < 1) {
        unaff_R14 = (ImGuiTabItem *)0x0;
      }
      else {
        lVar37 = 0;
        lVar22 = 0;
        unaff_R14 = (ImGuiTabItem *)0x0;
        do {
          pIVar28 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar28->Flags + lVar37 + 2) & 0x20) == 0) {
            iVar27 = *(int *)((long)&pIVar28->NameOffset + lVar37);
            if (((long)iVar27 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar27))
            goto LAB_001544be;
            pIVar28 = (ImGuiTabItem *)((long)&pIVar28->ID + lVar37);
            local_88.x = 0.0;
            local_88.y = 0.0;
            bVar18 = Selectable((tab_bar->TabsNames).Buf.Data + iVar27,
                                tab_bar->SelectedTabId == pIVar28->ID,0,(ImVec2 *)&local_88);
            if (bVar18) {
              unaff_R14 = pIVar28;
            }
          }
          lVar22 = lVar22 + 1;
          lVar37 = lVar37 + 0x28;
        } while (lVar22 < (tab_bar->Tabs).Size);
      }
      EndPopup();
      pIVar38 = local_100;
    }
    *(undefined8 *)(local_c8._0_8_ + 0xd8) = local_a8._0_8_;
    if (unaff_R14 != (ImGuiTabItem *)0x0) {
      local_104 = unaff_R14->ID;
      tab_bar->SelectedTabId = local_104;
    }
  }
  local_b4[0] = 0;
  local_b4[1] = iVar21 + (int)fVar42;
  local_ac = fVar42;
  iVar21 = (tab_bar->Tabs).Size;
  iVar27 = (pIVar38->ShrinkWidthBuffer).Capacity;
  if (iVar27 < iVar21) {
    if (iVar27 == 0) {
      iVar39 = 8;
    }
    else {
      iVar39 = iVar27 / 2 + iVar27;
    }
    if (iVar39 <= iVar21) {
      iVar39 = iVar21;
    }
    if (iVar27 < iVar39) {
      unaff_R14 = (ImGuiTabItem *)MemAlloc((long)iVar39 << 3);
      pIVar5 = (pIVar38->ShrinkWidthBuffer).Data;
      if (pIVar5 != (ImGuiShrinkWidthItem *)0x0) {
        memcpy(unaff_R14,pIVar5,(long)(pIVar38->ShrinkWidthBuffer).Size << 3);
        MemFree((pIVar38->ShrinkWidthBuffer).Data);
      }
      (pIVar38->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)unaff_R14;
      (pIVar38->ShrinkWidthBuffer).Capacity = iVar39;
    }
  }
  (pIVar38->ShrinkWidthBuffer).Size = iVar21;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_c8._8_8_;
  local_c8 = auVar15 << 0x40;
  if ((tab_bar->Tabs).Size < 1) {
    bVar18 = true;
    pIVar40 = (ImGuiID *)0x0;
  }
  else {
    lVar22 = 0;
    unaff_R14 = (ImGuiTabItem *)0x0;
    pIVar40 = (ImGuiID *)0x0;
    bVar18 = false;
    iVar21 = -1;
    do {
      pIVar28 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar28->LastFrameVisible + lVar22) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                      ,0x1c38,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      pIVar23 = (ImGuiID *)((long)&pIVar28->ID + lVar22);
      if (((pIVar40 == (ImGuiID *)0x0) ||
          ((int)pIVar40[3] < *(int *)((long)&pIVar28->LastFrameSelected + lVar22))) &&
         ((*(byte *)((long)&pIVar28->Flags + lVar22 + 2) & 0x20) == 0)) {
        pIVar40 = pIVar23;
      }
      IVar3 = *pIVar23;
      if (IVar3 == tab_bar->SelectedTabId) {
        bVar18 = true;
      }
      if ((local_104 == 0) && (local_104 = IVar3, local_100->NavJustMovedToId != IVar3)) {
        local_104 = 0;
      }
      iVar27 = *(int *)((long)&pIVar28->NameOffset + lVar22);
      if (((long)iVar27 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar27)) {
LAB_001544be:
        __assert_fail("tab->NameOffset != -1 && tab->NameOffset < TabsNames.Buf.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                      ,0x7e5,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
      }
      IVar6 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data + iVar27,
                              (*(uint *)((long)&pIVar28->Flags + lVar22) >> 0x14 & 1) == 0);
      auVar15 = local_c8;
      fVar43 = IVar6.x;
      *(float *)((long)&pIVar28->ContentWidth + lVar22) = fVar43;
      uVar36 = *(uint *)((long)&pIVar28->Flags + lVar22);
      uVar33 = (ulong)(((char)uVar36 < '\0') + 1);
      if ((uVar36 & 0x40) != 0) {
        uVar33 = 0;
      }
      fVar41 = 0.0;
      if ((int)uVar33 == iVar21) {
        fVar41 = (local_100->Style).ItemInnerSpacing.x;
      }
      local_f8[uVar33 * 3 + 1] = fVar41 + fVar43 + local_f8[uVar33 * 3 + 1];
      iVar21 = local_b4[uVar33];
      lVar37 = (long)iVar21;
      local_b4[uVar33] = iVar21 + 1;
      if ((lVar37 < 0) || ((local_100->ShrinkWidthBuffer).Size <= iVar21)) goto LAB_001544a7;
      pIVar5 = (local_100->ShrinkWidthBuffer).Data;
      pIVar5[lVar37].Index = (int)unaff_R14;
      if ((local_100->ShrinkWidthBuffer).Size <= iVar21) goto LAB_001544a7;
      pIVar5[lVar37].Width = fVar43;
      if (fVar43 <= 0.0) {
        __assert_fail("tab->ContentWidth > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                      ,0x1c53,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      *(float *)((long)&pIVar28->Width + lVar22) = fVar43;
      unaff_R14 = (ImGuiTabItem *)((long)&unaff_R14->ID + 1);
      iVar27 = (tab_bar->Tabs).Size;
      lVar22 = lVar22 + 0x28;
      iVar21 = (int)uVar33;
    } while ((long)unaff_R14 < (long)iVar27);
    local_c8._1_7_ = 0;
    local_c8[0] = 1 < iVar27;
    local_c8._8_8_ = auVar15._8_8_;
    bVar18 = !bVar18;
    pIVar38 = local_100;
  }
  tab_bar->WidthAllTabsIdeal = 0.0;
  fVar43 = 0.0;
  lVar22 = 8;
  do {
    fVar43 = fVar43 + *(float *)((long)&local_100 + lVar22 + 4) +
                      *(float *)((long)local_f8 + lVar22);
    lVar22 = lVar22 + 0xc;
  } while (lVar22 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar43;
  pIVar16 = GImGui;
  if (((local_c8[0] & (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x < fVar43) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar4 = GImGui->CurrentWindow;
    fVar41 = GImGui->FontSize + -2.0;
    local_c8 = ZEXT416((uint)fVar41);
    fVar43 = (GImGui->Style).FramePadding.y;
    _local_98 = ZEXT416((uint)(fVar43 + fVar43 + GImGui->FontSize));
    local_a8 = ZEXT416((uint)(fVar41 + fVar41));
    local_70 = (pIVar4->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar13 = (GImGui->Style).Colors[0].z;
    uVar14 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar14 * 0.5;
    local_58.z = (float)uVar13;
    unaff_R14 = (ImGuiTabItem *)0x0;
    local_68 = pIVar40;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    local_60._0_4_ = (pIVar16->IO).KeyRepeatDelay;
    local_60._4_4_ = (pIVar16->IO).KeyRepeatRate;
    (pIVar16->IO).KeyRepeatDelay = 0.25;
    (pIVar16->IO).KeyRepeatRate = 0.2;
    fVar43 = (tab_bar->BarRect).Min.x;
    fVar41 = (tab_bar->BarRect).Max.x - (float)local_a8._0_4_;
    uVar36 = -(uint)(fVar41 <= fVar43);
    fVar41 = (float)(uVar36 & (uint)fVar43 | ~uVar36 & (uint)fVar41);
    local_48 = ZEXT416((uint)fVar41);
    fVar43 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = fVar41;
    (pIVar4->DC).CursorPos.y = fVar43;
    uVar17 = local_98._0_4_;
    uStack_8c = local_98._4_4_;
    local_98._4_4_ = local_98._0_4_;
    local_98._0_4_ = local_c8._0_4_;
    uStack_90 = local_c8._4_4_;
    IVar6.y = (float)uVar17;
    IVar6.x = (float)local_c8._0_4_;
    bVar19 = ArrowButtonEx("##<",0,IVar6,0x410);
    fVar43 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = (float)local_48._0_4_ + (float)local_c8._0_4_;
    (pIVar4->DC).CursorPos.y = fVar43;
    pIVar28 = (ImGuiTabItem *)0x1;
    bVar20 = ArrowButtonEx("##>",1,(ImVec2)local_98,0x410);
    iVar21 = -(uint)bVar19;
    if (bVar20) {
      iVar21 = 1;
    }
    PopStyleColor(2);
    pIVar38 = local_100;
    (pIVar16->IO).KeyRepeatDelay = (float)(undefined4)local_60;
    (pIVar16->IO).KeyRepeatRate = (float)local_60._4_4_;
    if (iVar21 != 0) {
      IVar3 = tab_bar->SelectedTabId;
      if (IVar3 == 0) {
LAB_00153de7:
        pIVar28 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar33 = (ulong)(tab_bar->Tabs).Size;
        bVar19 = 0 < (long)uVar33;
        if (0 < (long)uVar33) {
          pIVar28 = (tab_bar->Tabs).Data;
          bVar19 = true;
          if (pIVar28->ID != IVar3) {
            pIVar32 = pIVar28 + (uVar33 - 1);
            uVar31 = 0;
            pIVar29 = pIVar28;
            do {
              uVar26 = uVar33;
              pIVar28 = pIVar32;
              if (uVar33 - 1 == uVar31) break;
              pIVar28 = pIVar29 + 1;
              uVar26 = uVar31 + 1;
              pIVar1 = pIVar29 + 1;
              uVar31 = uVar26;
              pIVar29 = pIVar28;
            } while (pIVar1->ID != IVar3);
            bVar19 = uVar26 < uVar33;
          }
        }
        if (!bVar19) goto LAB_00153de7;
      }
      if (pIVar28 == (ImGuiTabItem *)0x0) {
        unaff_R14 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar36 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar28);
        uVar24 = uVar36 + iVar21;
        iVar27 = (tab_bar->Tabs).Size;
        do {
          uVar30 = uVar36;
          if ((int)uVar24 < iVar27) {
            uVar30 = uVar24;
          }
          if ((int)uVar24 < 0) {
            uVar30 = uVar36;
          }
          if (((int)uVar30 < 0) || (iVar27 <= (int)uVar30)) goto LAB_00154488;
          unaff_R14 = (tab_bar->Tabs).Data + uVar30;
          if ((unaff_R14->Flags & 0x200000U) != 0) {
            pIVar28 = unaff_R14;
            if ((int)(uVar24 + iVar21) < iVar27) {
              pIVar28 = (ImGuiTabItem *)0x0;
            }
            uVar24 = uVar24 + iVar21;
            if (-1 < (int)uVar24) {
              unaff_R14 = pIVar28;
            }
            uVar36 = uVar36 + iVar21;
          }
        } while (unaff_R14 == (ImGuiTabItem *)0x0);
      }
    }
    (pIVar4->DC).CursorPos = local_70;
    (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - ((float)local_a8._0_4_ + 1.0);
    pIVar40 = local_68;
    if ((unaff_R14 != (ImGuiTabItem *)0x0) &&
       (local_104 = unaff_R14->ID, (unaff_R14->Flags & 0x200000U) == 0)) {
      tab_bar->SelectedTabId = local_104;
    }
  }
  fVar43 = local_f8[1] + local_f8[2] + uStack_e0._4_4_ + local_d8;
  fVar41 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  if (fVar43 < fVar41) {
    fVar42 = (local_e8._4_4_ + (float)local_e8) -
             ((fVar41 - (local_f8[1] + local_f8[2])) - (uStack_e0._4_4_ + local_d8));
    fVar42 = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
  }
  else {
    fVar42 = fVar43 - fVar41;
  }
  if ((0.0 < fVar42) && ((fVar41 <= fVar43 || ((tab_bar->Flags & 0x40U) != 0)))) {
    uVar36 = (int)uStack_e0 + (int)local_f8[0];
    unaff_R14 = (ImGuiTabItem *)(ulong)uVar36;
    if (fVar41 <= fVar43) {
      unaff_R14 = (ImGuiTabItem *)0x0;
    }
    else {
      uVar36 = uStack_ec;
    }
    iVar21 = (int)unaff_R14;
    ShrinkWidths((pIVar38->ShrinkWidthBuffer).Data + iVar21,uVar36,fVar42);
    if (0 < (int)uVar36) {
      pIVar28 = unaff_R14;
      do {
        if ((iVar21 < 0) || ((pIVar38->ShrinkWidthBuffer).Size <= (int)pIVar28)) goto LAB_001544a7;
        pIVar5 = (pIVar38->ShrinkWidthBuffer).Data;
        iVar27 = pIVar5[(long)pIVar28].Index;
        lVar22 = (long)iVar27;
        if ((lVar22 < 0) || ((tab_bar->Tabs).Size <= iVar27)) goto LAB_00154488;
        iVar27 = (int)pIVar5[(long)pIVar28].Width;
        if (-1 < iVar27) {
          pIVar29 = (tab_bar->Tabs).Data;
          fVar43 = (float)iVar27;
          lVar37 = (ulong)((char)pIVar29[lVar22].Flags < '\0') + 1;
          if ((pIVar29[lVar22].Flags & 0x40U) != 0) {
            lVar37 = 0;
          }
          local_f8[lVar37 * 3 + 1] = local_f8[lVar37 * 3 + 1] - (pIVar29[lVar22].Width - fVar43);
          pIVar29[lVar22].Width = fVar43;
        }
        pIVar28 = (ImGuiTabItem *)((long)&pIVar28->ID + 1);
      } while ((int)pIVar28 < (int)(uVar36 + iVar21));
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  lVar22 = 0;
  fVar43 = 0.0;
  uVar36 = 0;
  do {
    fVar41 = fVar43;
    if ((lVar22 == 2) &&
       (fVar41 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_f8[7],
       fVar41 = (float)(~-(uint)(fVar41 <= 0.0) & (uint)fVar41), fVar43 <= fVar41)) {
      fVar41 = fVar43;
    }
    fVar42 = local_f8[lVar22 * 3];
    lVar37 = (long)(int)fVar42;
    if (0 < lVar37) {
      lVar34 = (ulong)uVar36 * 0x28 + 0x14;
      lVar35 = 0;
      do {
        if (((int)uVar36 < 0) || ((tab_bar->Tabs).Size <= (int)(uVar36 + (int)lVar35)))
        goto LAB_00154488;
        pIVar28 = (tab_bar->Tabs).Data;
        *(float *)((long)pIVar28 + lVar34 + -4) = fVar41;
        fVar43 = 0.0;
        if (lVar35 < lVar37 + -1) {
          fVar43 = (pIVar38->Style).ItemInnerSpacing.x;
        }
        fVar41 = fVar41 + fVar43 + *(float *)((long)&pIVar28->ID + lVar34);
        lVar35 = lVar35 + 1;
        lVar34 = lVar34 + 0x28;
      } while (lVar37 != lVar35);
    }
    fVar43 = local_f8[lVar22 * 3 + 2];
    fVar44 = local_f8[lVar22 * 3 + 1] + fVar43;
    tab_bar->WidthAllTabs = (float)(-(uint)(0.0 <= fVar44) & (uint)fVar44) + tab_bar->WidthAllTabs;
    fVar43 = fVar41 + fVar43;
    uVar36 = (int)fVar42 + uVar36;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 3);
  if (bVar18) {
    tab_bar->SelectedTabId = 0;
  }
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (pIVar40 != (ImGuiID *)0x0)) {
    local_104 = *pIVar40;
    tab_bar->SelectedTabId = local_104;
  }
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  if (local_104 != 0) {
    uVar33 = (ulong)(tab_bar->Tabs).Size;
    bVar18 = 0 < (long)uVar33;
    if (0 < (long)uVar33) {
      unaff_R14 = (tab_bar->Tabs).Data;
      bVar18 = true;
      if (unaff_R14->ID != local_104) {
        pIVar29 = unaff_R14 + (uVar33 - 1);
        uVar31 = 0;
        pIVar28 = unaff_R14;
        do {
          uVar26 = uVar33;
          unaff_R14 = pIVar29;
          if (uVar33 - 1 == uVar31) break;
          unaff_R14 = pIVar28 + 1;
          uVar26 = uVar31 + 1;
          pIVar32 = pIVar28 + 1;
          uVar31 = uVar26;
          pIVar28 = unaff_R14;
        } while (pIVar32->ID != local_104);
        bVar18 = uVar26 < uVar33;
      }
    }
    if (((bVar18) && (unaff_R14 != (ImGuiTabItem *)0x0)) && ((unaff_R14->Flags & 0xc0) == 0)) {
      fVar43 = GImGui->FontSize;
      iVar21 = ImGuiTabBar::GetTabOrder(tab_bar,unaff_R14);
      fVar42 = unaff_R14->Offset - local_f8[1];
      fVar41 = fVar43;
      if (iVar21 < (int)local_f8[0]) {
        fVar41 = -0.0;
      }
      fVar41 = fVar42 - fVar41;
      if ((tab_bar->Tabs).Size - (int)uStack_e0 <= iVar21 + 1) {
        fVar43 = 1.0;
      }
      fVar43 = fVar42 + unaff_R14->Width + fVar43;
      fVar42 = ((((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_f8[1]) -
               uStack_e0._4_4_) - local_e8._4_4_;
      tab_bar->ScrollingTargetDistToVisibility = 0.0;
      if ((fVar41 < tab_bar->ScrollingTarget) || (fVar42 <= fVar43 - fVar41)) {
        fVar44 = tab_bar->ScrollingAnim - fVar43;
      }
      else {
        if (fVar43 - fVar42 <= tab_bar->ScrollingTarget) goto LAB_0015424f;
        fVar44 = (fVar41 - fVar42) - tab_bar->ScrollingAnim;
        fVar41 = fVar43 - fVar42;
      }
      tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar44) & (uint)fVar44);
      tab_bar->ScrollingTarget = fVar41;
    }
  }
LAB_0015424f:
  fVar43 = (tab_bar->BarRect).Min.x;
  fVar41 = (tab_bar->BarRect).Max.x;
  fVar44 = tab_bar->WidthAllTabs - (fVar41 - fVar43);
  fVar42 = tab_bar->ScrollingAnim;
  if (fVar44 <= tab_bar->ScrollingAnim) {
    fVar42 = fVar44;
  }
  fVar42 = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
  tab_bar->ScrollingAnim = fVar42;
  fVar45 = tab_bar->ScrollingTarget;
  if (fVar44 <= tab_bar->ScrollingTarget) {
    fVar45 = fVar44;
  }
  fVar45 = (float)(-(uint)(0.0 <= fVar45) & (uint)fVar45);
  tab_bar->ScrollingTarget = fVar45;
  if ((fVar42 != fVar45) || (NAN(fVar42) || NAN(fVar45))) {
    fVar44 = pIVar38->FontSize;
    fVar46 = fVar44 * 70.0;
    uVar36 = -(uint)(fVar46 <= tab_bar->ScrollingSpeed);
    fVar47 = ABS(fVar45 - fVar42) / 0.3;
    fVar46 = (float)(~uVar36 & (uint)fVar46 | (uint)tab_bar->ScrollingSpeed & uVar36);
    uVar36 = -(uint)(fVar47 <= fVar46);
    fVar47 = (float)(~uVar36 & (uint)fVar47 | uVar36 & (uint)fVar46);
    tab_bar->ScrollingSpeed = fVar47;
    fVar46 = fVar45;
    if ((pIVar38->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar44 * 10.0)) {
      fVar47 = fVar47 * (pIVar38->IO).DeltaTime;
      if (fVar45 <= fVar42) {
        fVar46 = fVar42;
        if (fVar45 < fVar42) {
          fVar42 = fVar42 - fVar47;
          uVar36 = -(uint)(fVar45 <= fVar42);
          fVar46 = (float)((uint)fVar42 & uVar36 | ~uVar36 & (uint)fVar45);
        }
      }
      else {
        fVar46 = fVar47 + fVar42;
        if (fVar45 <= fVar46) {
          fVar46 = fVar45;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar46;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar43 + local_f8[1] + local_f8[2];
  tab_bar->ScrollingRectMaxX = (fVar41 - uStack_e0._4_4_) - local_e8._4_4_;
  if ((tab_bar->Flags & 0x100000) == 0) {
    iVar21 = (tab_bar->TabsNames).Buf.Capacity;
    if (iVar21 < 0) {
      uVar36 = iVar21 / 2 + iVar21;
      size = 0;
      if (0 < (int)uVar36) {
        size = (size_t)uVar36;
      }
      __dest = (char *)MemAlloc(size);
      pcVar25 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar25 != (char *)0x0) {
        memcpy(__dest,pcVar25,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest;
      (tab_bar->TabsNames).Buf.Capacity = (int)size;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  pIVar4 = pIVar38->CurrentWindow;
  (pIVar4->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabs;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  fVar41 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar43 = (pIVar4->DC).IdealMaxPos.x;
  uVar36 = -(uint)(fVar41 <= fVar43);
  (pIVar4->DC).IdealMaxPos.x = (float)(uVar36 & (uint)fVar43 | ~uVar36 & (uint)fVar41);
  return;
LAB_001544a7:
  pcVar25 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_0015449d;
LAB_00154488:
  pcVar25 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_0015449d:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,pcVar25);
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}